

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_variables(CompilerHLSL *this)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var2;
  StorageClass SVar3;
  uint uVar4;
  size_t sVar5;
  Variant *pVVar6;
  TypedID<(spirv_cross::Types)3> *pTVar7;
  undefined8 uVar8;
  bool bVar9;
  uint32_t uVar10;
  SPIRVariable *var;
  SPIRType *pSVar11;
  mapped_type *pmVar12;
  uint *puVar13;
  uint *ts_1;
  BaseType *pBVar14;
  TypedID<(spirv_cross::Types)0> *id;
  _Hash_node_base *p_Var15;
  TypedID<(spirv_cross::Types)0> *pTVar16;
  long lVar17;
  __hashtable *__h;
  __node_base _Var18;
  long lVar19;
  ulong uVar20;
  BaseType sample_mask_out_basetype;
  BaseType sample_mask_in_basetype;
  __alloc_node_gen_t __alloc_node_gen;
  Bitset builtins;
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
  builtin_to_initializer;
  BaseType local_118 [2];
  undefined1 local_110 [16];
  undefined1 local_100 [40];
  undefined1 local_d8 [16];
  undefined1 local_c8 [40];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_c8._32_8_ = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower;
  p_Var2 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)(local_c8 + 0x28);
  local_a0._M_buckets = (__buckets_ptr)0x0;
  local_a0._M_bucket_count =
       (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h._M_bucket_count;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ts_1 = (uint *)(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
                 _M_element_count;
  local_a0._M_rehash_policy._0_8_ =
       *(undefined8 *)
        &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
         _M_rehash_policy;
  local_a0._M_rehash_policy._M_next_resize =
       (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h._M_rehash_policy.
       _M_next_resize;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_110._0_8_ = p_Var2;
  local_a0._M_element_count = (size_type)ts_1;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            (p_Var2,&(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> *)
             local_110);
  local_c8._32_8_ =
       local_c8._32_8_ | (this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower;
  p_Var15 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
            _M_before_begin._M_nxt;
  if (p_Var15 != (_Hash_node_base *)0x0) {
    do {
      local_110._0_8_ = p_Var2;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (p_Var2,p_Var15 + 1,local_110);
      p_Var15 = p_Var15->_M_nxt;
    } while (p_Var15 != (_Hash_node_base *)0x0);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_118[1] = 1;
  local_118[0] = Void;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar16 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar1 = pTVar16 + sVar5;
    do {
      uVar20 = (ulong)pTVar16->id;
      pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      ts_1 = (uint *)(uVar20 * 3);
      if (pVVar6[uVar20].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar6 + uVar20);
        bVar9 = Compiler::is_builtin_variable((Compiler *)this,var);
        if (bVar9) {
          pSVar11 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(var->super_IVariant).field_0xc);
          uVar10 = Compiler::get_decoration
                             ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
          SVar3 = var->storage;
          pBVar14 = local_118 + 1;
          if ((SVar3 == StorageClassInput && (uVar10 ^ 0x14) == 0) ||
             (pBVar14 = local_118, (uVar10 ^ 0x14) == 0 && SVar3 == StorageClassOutput)) {
            *pBVar14 = pSVar11->basetype;
          }
          puVar13 = (uint *)(ulong)(var->initializer).id;
          ts_1 = puVar13;
          if ((SVar3 == StorageClassOutput && puVar13 != (uint *)0x0) &&
             (puVar13 < (uint *)(this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.buffer_size)) {
            pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr;
            ts_1 = (uint *)((long)puVar13 * 3);
            if (pVVar6[(long)puVar13].type == TypeConstant) {
              local_c8._16_8_ = Variant::get<spirv_cross::SPIRConstant>(pVVar6 + (long)puVar13);
              if (pSVar11->basetype == Struct) {
                local_c8._24_8_ =
                     ZEXT48((uint)(pSVar11->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size);
                if (local_c8._24_8_ != 0) {
                  uVar20 = 0;
                  do {
                    ts_1 = (uint *)0xb;
                    bVar9 = Compiler::has_member_decoration
                                      ((Compiler *)this,(TypeID)(pSVar11->super_IVariant).self.id,
                                       (uint32_t)uVar20,DecorationBuiltIn);
                    if (bVar9) {
                      pTVar7 = (((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)
                                (local_c8._16_8_ + 0x110))->
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
                      uVar10 = Compiler::get_member_decoration
                                         ((Compiler *)this,(TypeID)(pSVar11->super_IVariant).self.id
                                          ,(uint32_t)uVar20,DecorationBuiltIn);
                      local_d8._0_4_ = uVar10;
                      pmVar12 = ::std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)&local_68,(key_type *)local_d8);
                      uVar4 = pTVar7[uVar20].id;
                      ts_1 = (uint *)(ulong)uVar4;
                      pmVar12->id = uVar4;
                    }
                    uVar20 = uVar20 + 1;
                  } while (local_c8._24_8_ != uVar20);
                }
              }
              else {
                bVar9 = Compiler::has_decoration
                                  ((Compiler *)this,(ID)(var->super_IVariant).self.id,
                                   DecorationBuiltIn);
                if (bVar9) {
                  local_d8._0_4_ = uVar10;
                  pmVar12 = ::std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_68,(key_type *)local_d8);
                  uVar4 = (var->initializer).id;
                  ts_1 = (uint *)(ulong)uVar4;
                  pmVar12->id = uVar4;
                }
              }
            }
          }
        }
      }
      pTVar16 = pTVar16 + 1;
    } while (pTVar16 != pTVar1);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_110);
  local_d8._0_8_ = &local_68;
  local_c8._0_8_ = local_118 + 1;
  uVar20 = 0;
  local_d8._8_8_ = this;
  local_c8._8_8_ = local_118;
  do {
    if (((ulong)local_c8._32_8_ >> (uVar20 & 0x3f) & 1) != 0) {
      emit_builtin_variables::anon_class_32_4_fdb8fe48::operator()
                ((anon_class_32_4_fdb8fe48 *)local_d8,(uint32_t)uVar20);
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0x40);
  if ((uint *)local_a0._M_element_count != (uint *)0x0) {
    local_110._8_8_ = 0;
    local_100._0_8_ = 8;
    local_110._0_8_ =
         (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          *)(local_100 + 8);
    SmallVector<unsigned_int,_8UL>::reserve
              ((SmallVector<unsigned_int,_8UL> *)local_110,local_a0._M_element_count);
    if (local_a0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var18._M_nxt = local_a0._M_before_begin._M_nxt;
      do {
        SmallVector<unsigned_int,_8UL>::reserve
                  ((SmallVector<unsigned_int,_8UL> *)local_110,local_110._8_8_ + 1);
        *(int *)(local_110._0_8_ + local_110._8_8_ * 4) = (int)((long *)_Var18._M_nxt)[1];
        local_110._8_8_ = local_110._8_8_ + 1;
        _Var18._M_nxt = (_Var18._M_nxt)->_M_nxt;
      } while (_Var18._M_nxt != (_Hash_node_base *)0x0);
    }
    uVar8 = local_110._0_8_;
    if (local_110._8_8_ != 0) {
      p_Var2 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)(local_110._0_8_ + local_110._8_8_ * 4);
      lVar17 = 0x3f;
      if (local_110._8_8_ != 0) {
        for (; (ulong)local_110._8_8_ >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_110._0_8_,p_Var2,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(uVar8,p_Var2);
      uVar8 = local_110._0_8_;
      if (local_110._8_8_ != 0) {
        lVar19 = local_110._8_8_ << 2;
        lVar17 = 0;
        do {
          emit_builtin_variables::anon_class_32_4_fdb8fe48::operator()
                    ((anon_class_32_4_fdb8fe48 *)local_d8,*(uint32_t *)(uVar8 + lVar17));
          lVar17 = lVar17 + 4;
        } while (lVar19 != lVar17);
      }
    }
    local_110._8_8_ = 0;
    if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)local_110._0_8_ !=
        (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)(local_100 + 8)) {
      free((void *)local_110._0_8_);
    }
  }
  if (((this->base_vertex_info).used == true) && ((this->hlsl_options).shader_model < 0x44)) {
    local_110._8_8_ = 0;
    local_100._0_8_ = local_100._0_8_ & 0xffffffffffffff00;
    local_110._0_8_ =
         (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          *)local_100;
    if ((this->base_vertex_info).explicit_binding == true) {
      join<char_const(&)[14],unsigned_int&>
                ((string *)local_d8,(spirv_cross *)" : register(b",
                 (char (*) [14])&this->base_vertex_info,ts_1);
      ::std::__cxx11::string::operator=((string *)local_110,(string *)local_d8);
      if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_d8._0_8_ !=
          (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_c8) {
        operator_delete((void *)local_d8._0_8_);
      }
      if ((this->base_vertex_info).register_space != 0) {
        join<char_const(&)[8],unsigned_int&>
                  ((string *)local_d8,(spirv_cross *)", space",
                   (char (*) [8])&(this->base_vertex_info).register_space,ts_1);
        ::std::__cxx11::string::_M_append(local_110,local_d8._0_8_);
        if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)local_d8._0_8_ !=
            (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)local_c8) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
      ::std::__cxx11::string::append(local_110);
    }
    CompilerGLSL::statement<char_const(&)[31],std::__cxx11::string&>
              (&this->super_CompilerGLSL,(char (*) [31])"cbuffer SPIRV_Cross_VertexInfo",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[28]>(&this->super_CompilerGLSL,(char (*) [28])0x2bb30d);
    CompilerGLSL::statement<char_const(&)[30]>(&this->super_CompilerGLSL,(char (*) [30])0x2bb2b7);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2aec75);
    if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)local_110._0_8_ !=
        (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)local_100) {
      operator_delete((void *)local_110._0_8_);
    }
  }
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_c8 + 0x28));
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_variables()
{
	Bitset builtins = active_input_builtins;
	builtins.merge_or(active_output_builtins);

	std::unordered_map<uint32_t, ID> builtin_to_initializer;

	// We need to declare sample mask with the same type that module declares it.
	// Sample mask is somewhat special in that SPIR-V has an array, and we can copy that array, so we need to
	// match sign.
	SPIRType::BaseType sample_mask_in_basetype = SPIRType::Void;
	SPIRType::BaseType sample_mask_out_basetype = SPIRType::Void;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (!is_builtin_variable(var))
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

		if (var.storage == StorageClassInput && builtin == BuiltInSampleMask)
			sample_mask_in_basetype = type.basetype;
		else if (var.storage == StorageClassOutput && builtin == BuiltInSampleMask)
			sample_mask_out_basetype = type.basetype;

		if (var.initializer && var.storage == StorageClassOutput)
		{
			auto *c = this->maybe_get<SPIRConstant>(var.initializer);
			if (!c)
				return;

			if (type.basetype == SPIRType::Struct)
			{
				uint32_t member_count = uint32_t(type.member_types.size());
				for (uint32_t i = 0; i < member_count; i++)
				{
					if (has_member_decoration(type.self, i, DecorationBuiltIn))
					{
						builtin_to_initializer[get_member_decoration(type.self, i, DecorationBuiltIn)] =
								c->subconstants[i];
					}
				}
			}
			else if (has_decoration(var.self, DecorationBuiltIn))
			{
				builtin_to_initializer[builtin] = var.initializer;
			}
		}
	});

	// Emit global variables for the interface variables which are statically used by the shader.
	builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		uint32_t array_size = 0;

		string init_expr;
		auto init_itr = builtin_to_initializer.find(builtin);
		if (init_itr != builtin_to_initializer.end())
			init_expr = join(" = ", to_expression(init_itr->second));

		if (get_execution_model() == ExecutionModelMeshEXT)
		{
			if (builtin == BuiltInPosition || builtin == BuiltInPointSize || builtin == BuiltInClipDistance ||
			    builtin == BuiltInCullDistance || builtin == BuiltInLayer || builtin == BuiltInPrimitiveId ||
			    builtin == BuiltInViewportIndex || builtin == BuiltInCullPrimitiveEXT ||
			    builtin == BuiltInPrimitiveShadingRateKHR || builtin == BuiltInPrimitivePointIndicesEXT ||
			    builtin == BuiltInPrimitiveLineIndicesEXT || builtin == BuiltInPrimitiveTriangleIndicesEXT)
			{
				return;
			}
		}

		switch (builtin)
		{
		case BuiltInFragCoord:
		case BuiltInPosition:
			type = "float4";
			break;

		case BuiltInFragDepth:
			type = "float";
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			type = "int";
			if (hlsl_options.support_nonzero_base_vertex_base_instance || hlsl_options.shader_model >= 68)
				base_vertex_info.used = true;
			break;

		case BuiltInBaseVertex:
		case BuiltInBaseInstance:
			type = "int";
			base_vertex_info.used = true;
			break;

		case BuiltInInstanceId:
		case BuiltInSampleId:
			type = "int";
			break;

		case BuiltInPointSize:
			if (hlsl_options.point_size_compat || hlsl_options.shader_model <= 30)
			{
				// Just emit the global variable, it will be ignored.
				type = "float";
				break;
			}
			else
				SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));

		case BuiltInGlobalInvocationId:
		case BuiltInLocalInvocationId:
		case BuiltInWorkgroupId:
			type = "uint3";
			break;

		case BuiltInLocalInvocationIndex:
			type = "uint";
			break;

		case BuiltInFrontFacing:
			type = "bool";
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
			// Handled specially.
			break;

		case BuiltInSubgroupLocalInvocationId:
		case BuiltInSubgroupSize:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			break;

		case BuiltInSubgroupEqMask:
		case BuiltInSubgroupLtMask:
		case BuiltInSubgroupLeMask:
		case BuiltInSubgroupGtMask:
		case BuiltInSubgroupGeMask:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			type = "uint4";
			break;

		case BuiltInHelperInvocation:
			if (hlsl_options.shader_model < 50)
				SPIRV_CROSS_THROW("Need SM 5.0 for Helper Invocation.");
			break;

		case BuiltInClipDistance:
			array_size = clip_distance_count;
			type = "float";
			break;

		case BuiltInCullDistance:
			array_size = cull_distance_count;
			type = "float";
			break;

		case BuiltInSampleMask:
			if (active_input_builtins.get(BuiltInSampleMask))
				type = sample_mask_in_basetype == SPIRType::UInt ? "uint" : "int";
			else
				type = sample_mask_out_basetype == SPIRType::UInt ? "uint" : "int";
			array_size = 1;
			break;

		case BuiltInPrimitiveId:
		case BuiltInViewIndex:
		case BuiltInLayer:
			type = "uint";
			break;

		case BuiltInViewportIndex:
		case BuiltInPrimitiveShadingRateKHR:
		case BuiltInPrimitiveLineIndicesEXT:
		case BuiltInCullPrimitiveEXT:
			type = "uint";
			break;

		case BuiltInBaryCoordKHR:
		case BuiltInBaryCoordNoPerspKHR:
			if (hlsl_options.shader_model < 61)
				SPIRV_CROSS_THROW("Need SM 6.1 for barycentrics.");
			type = "float3";
			break;

		default:
			SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));
		}

		StorageClass storage = active_input_builtins.get(i) ? StorageClassInput : StorageClassOutput;

		if (type)
		{
			if (array_size)
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), "[", array_size, "]", init_expr, ";");
			else
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), init_expr, ";");
		}

		// SampleMask can be both in and out with sample builtin, in this case we have already
		// declared the input variable and we need to add the output one now.
		if (builtin == BuiltInSampleMask && storage == StorageClassInput && this->active_output_builtins.get(i))
		{
			type = sample_mask_out_basetype == SPIRType::UInt ? "uint" : "int";
			if (array_size)
				statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), "[", array_size, "]", init_expr, ";");
			else
				statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), init_expr, ";");
		}
	});

	if (base_vertex_info.used && hlsl_options.shader_model < 68)
	{
		string binding_info;
		if (base_vertex_info.explicit_binding)
		{
			binding_info = join(" : register(b", base_vertex_info.register_index);
			if (base_vertex_info.register_space)
				binding_info += join(", space", base_vertex_info.register_space);
			binding_info += ")";
		}
		statement("cbuffer SPIRV_Cross_VertexInfo", binding_info);
		begin_scope();
		statement("int SPIRV_Cross_BaseVertex;");
		statement("int SPIRV_Cross_BaseInstance;");
		end_scope_decl();
		statement("");
	}
}